

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

bool __thiscall
slang::ast::anon_unknown_39::lookupUpward
          (anon_unknown_39 *this,
          span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
          nameParts,NameComponents *name,ASTContext *context,bitmask<slang::ast::LookupFlags> flags,
          LookupResult *result)

{
  Symbol *this_00;
  size_t __n;
  LookupResult *this_01;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_01;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_02;
  byte in_AL;
  bool bVar1;
  bool bVar2;
  int iVar3;
  InstanceSymbol *pIVar4;
  DefinitionSymbol *pDVar5;
  Scope *this_02;
  Scope *pSVar6;
  __extent_storage<18446744073709551615UL> _Var7;
  uint32_t uVar8;
  __extent_storage<18446744073709551615UL> _Var9;
  bitmask<slang::ast::LookupFlags> flags_00;
  undefined4 in_register_0000008c;
  InstanceSymbol *local_50;
  
  _Var7 = nameParts._M_extent._M_extent_value;
  _Var9._M_extent_value = (size_t)nameParts._M_ptr;
  this_01 = (LookupResult *)CONCAT44(in_register_0000008c,flags.m_bits);
  flags_00.m_bits = (underlying_type)context;
  this_02 = (Scope *)(name->text)._M_len;
  local_50 = (InstanceSymbol *)0x0;
  uVar8 = 0;
  do {
    pIVar4 = (InstanceSymbol *)Scope::find(this_02,*(string_view *)_Var7._M_extent_value);
    if ((((pIVar4 == (InstanceSymbol *)0x0) || (bVar1 = Symbol::isValue((Symbol *)pIVar4), bVar1))
        || (bVar1 = Symbol::isType((Symbol *)pIVar4), bVar1)) ||
       ((pSVar6 = Symbol::scopeOrNull((Symbol *)pIVar4), pSVar6 == (Scope *)0x0 &&
        ((pIVar4->super_InstanceSymbolBase).super_Symbol.kind != Instance)))) {
LAB_00242e2e:
      this_00 = this_02->thisSym;
      if (this_00->kind == InstanceBody) {
        pIVar4 = (InstanceSymbol *)this_00[1].originatingSyntax;
        this_02 = (pIVar4->super_InstanceSymbolBase).super_Symbol.parentScope;
        pDVar5 = InstanceSymbol::getDefinition(pIVar4);
        __n = (pDVar5->super_Symbol).name._M_len;
        bVar1 = true;
        if ((__n == *(size_t *)_Var7._M_extent_value) &&
           ((__n == 0 ||
            (iVar3 = bcmp((pDVar5->super_Symbol).name._M_str,*(char **)(_Var7._M_extent_value + 8),
                          __n), iVar3 == 0)))) {
          if (local_50 == (InstanceSymbol *)0x0) {
            local_50 = pIVar4;
          }
          LookupResult::clear(this_01);
          this_01->found = (Symbol *)pIVar4;
          nameParts_00._M_extent._M_extent_value = _Var9._M_extent_value;
          nameParts_00._M_ptr = (pointer)this;
          bVar2 = lookupDownward(nameParts_00,*(NameComponents *)_Var7._M_extent_value,
                                 (ASTContext *)name,flags_00,this_01);
          if (bVar2) {
            if (this_01->found != (Symbol *)0x0) {
              this_01->upwardCount = uVar8;
              in_AL = 1;
              bVar1 = false;
            }
          }
          else {
            bVar1 = false;
            in_AL = 0;
          }
        }
        if (!bVar1) goto LAB_00242fa8;
      }
      else {
        this_02 = Symbol::getHierarchicalParent(this_00);
      }
      uVar8 = uVar8 + 1;
      bVar1 = true;
    }
    else {
      if (local_50 == (InstanceSymbol *)0x0) {
        local_50 = pIVar4;
      }
      LookupResult::clear(this_01);
      this_01->found = (Symbol *)pIVar4;
      nameParts_01._M_extent._M_extent_value = _Var9._M_extent_value;
      nameParts_01._M_ptr = (pointer)this;
      bVar1 = lookupDownward(nameParts_01,*(NameComponents *)_Var7._M_extent_value,
                             (ASTContext *)name,flags_00,this_01);
      if (bVar1) {
        if (this_01->found == (Symbol *)0x0) goto LAB_00242e2e;
        this_01->upwardCount = uVar8;
        in_AL = 1;
LAB_00242fa8:
        bVar1 = false;
      }
      else {
        bVar1 = false;
        in_AL = 0;
      }
    }
    if (!bVar1) goto LAB_00243027;
  } while (this_02 != (Scope *)0x0);
  LookupResult::clear(this_01);
  if (local_50 == (InstanceSymbol *)0x0) {
    in_AL = 1;
  }
  else {
    this_01->found = (Symbol *)local_50;
    nameParts_02._M_extent._M_extent_value = _Var9._M_extent_value;
    nameParts_02._M_ptr = (pointer)this;
    lookupDownward(nameParts_02,*(NameComponents *)_Var7._M_extent_value,(ASTContext *)name,flags_00
                   ,this_01);
    in_AL = 0;
  }
LAB_00243027:
  return (bool)(in_AL & 1);
}

Assistant:

bool lookupUpward(std::span<const NamePlusLoc> nameParts, const NameComponents& name,
                  const ASTContext& context, bitmask<LookupFlags> flags, LookupResult& result) {
    // Upward lookups can match either a scope name, or a module definition name (on any of the
    // instances). Imports are not considered.
    const Symbol* firstMatch = nullptr;
    auto tryMatch = [&](const Symbol& symbol) {
        // Keep track of the first match we find; if it turns out we can't
        // resolve all of the name parts we'll move on and try elsewhere,
        // but at the end if we couldn't find a full match we'll use this to
        // provide a better error.
        if (!firstMatch)
            firstMatch = &symbol;

        result.clear();
        result.found = &symbol;
        return lookupDownward(nameParts, name, context, flags, result);
    };

    uint32_t upwardCount = 0;
    const Scope* scope = context.scope;
    do {
        // Search for a scope or instance target within our current scope.
        auto symbol = scope->find(name.text);
        if (symbol && !symbol->isValue() && !symbol->isType() &&
            (symbol->isScope() || symbol->kind == SymbolKind::Instance)) {
            if (!tryMatch(*symbol))
                return false;

            if (result.found) {
                result.upwardCount = upwardCount;
                return true;
            }
        }

        // Advance to the next scope, skipping to the parent instance when
        // we hit an instance body instead of going on to the compilation unit.
        symbol = &scope->asSymbol();
        if (symbol->kind != SymbolKind::InstanceBody) {
            scope = symbol->getHierarchicalParent();
        }
        else {
            auto inst = symbol->as<InstanceBodySymbol>().parentInstance;
            SLANG_ASSERT(inst);

            // If the instance's definition name matches our target name,
            // try to match from the current instance.
            scope = inst->getParentScope();
            if (inst->getDefinition().name == name.text) {
                if (!tryMatch(*inst))
                    return false;

                if (result.found) {
                    result.upwardCount = upwardCount;
                    return true;
                }
            }
        }

        upwardCount++;
    } while (scope);

    result.clear();
    if (firstMatch) {
        // If we did find a match at some point, repeat that
        // lookup to provide a real error message.
        result.found = firstMatch;
        lookupDownward(nameParts, name, context, flags, result);
        return false;
    }
    return true;
}